

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

TValue * lj_clib_index(lua_State *L,CLibrary *cl,GCstr *name)

{
  long lVar1;
  CTypeID CVar2;
  lua_State *L_00;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  GCstr *in_RDX;
  long in_RSI;
  lua_State *in_RDI;
  GCcdata *cd;
  void *p;
  char *sym;
  CType *ctt;
  CTypeID id;
  CType *ct;
  CTState *cts;
  TValue *tv;
  CTState *cts_1;
  GCcdata *cd_1;
  GCobj *o;
  char *in_stack_fffffffffffffea8;
  lua_State *in_stack_fffffffffffffeb0;
  GCstr *in_stack_fffffffffffffeb8;
  GCtab *in_stack_fffffffffffffec0;
  lua_State *in_stack_fffffffffffffec8;
  CType *local_128;
  CTState *local_120;
  TValue *local_118;
  GCstr *local_110;
  long local_108;
  lua_State *local_100;
  CTState *local_f8;
  lua_State *local_f0;
  undefined4 local_c0;
  CTypeID local_bc;
  CTState *local_b8;
  
  local_110 = in_RDX;
  local_108 = in_RSI;
  local_100 = in_RDI;
  local_118 = lj_tab_setstr(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffeb8);
  if ((local_118->field_2).it == 0xffffffff) {
    local_f0 = local_100;
    local_120 = (CTState *)(ulong)*(uint *)((ulong)(local_100->glref).ptr32 + 0x194);
    local_120->L = local_100;
    local_f8 = local_120;
    CVar2 = lj_ctype_getname(local_120,&local_128,local_110,0x1840);
    if (CVar2 == 0) {
      lj_err_callerv(local_100,LJ_ERR_FFI_NODECL,local_110 + 1);
    }
    if (local_128->info >> 0x1c == 0xb) {
      if (((local_120->tab[local_128->info & 0xffff].info & 0x800000) == 0) ||
         (-1 < (int)local_128->size)) {
        local_118->n = (double)(int)local_128->size;
      }
      else {
        local_118->n = (double)local_128->size;
      }
    }
    else {
      L_00 = (lua_State *)clib_extsym(local_120,local_128,local_110);
      pvVar3 = clib_getsym((CLibrary *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (pvVar3 == (void *)0x0) {
        clib_error_(in_stack_fffffffffffffeb0);
      }
      local_b8 = local_120;
      local_c0 = 8;
      local_bc = CVar2;
      pvVar4 = lj_mem_newgco(L_00,(GCSize)((ulong)pvVar3 >> 0x20));
      *(undefined1 *)((long)pvVar4 + 5) = 10;
      *(short *)((long)pvVar4 + 6) = (short)local_bc;
      uVar5 = (ulong)(local_b8->L->glref).ptr32;
      *(long *)(uVar5 + 0xe0) = *(long *)(uVar5 + 0xe0) + 1;
      *(void **)((long)pvVar4 + 8) = pvVar3;
      (local_118->u32).lo = (uint32_t)pvVar4;
      (local_118->field_2).it = 0xfffffff5;
      if ((*(byte *)(*(long *)(local_108 + 8) + 4) & 4) != 0) {
        uVar5 = (ulong)(local_100->glref).ptr32;
        lVar1 = *(long *)(local_108 + 8);
        *(byte *)(lVar1 + 4) = *(byte *)(lVar1 + 4) & 0xfb;
        *(undefined4 *)(lVar1 + 0xc) = *(undefined4 *)(uVar5 + 0x6c);
        *(int *)(uVar5 + 0x6c) = (int)lVar1;
      }
    }
  }
  return local_118;
}

Assistant:

TValue *lj_clib_index(lua_State *L, CLibrary *cl, GCstr *name)
{
  TValue *tv = lj_tab_setstr(L, cl->cache, name);
  if (LJ_UNLIKELY(tvisnil(tv))) {
    CTState *cts = ctype_cts(L);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    if (!id)
      lj_err_callerv(L, LJ_ERR_FFI_NODECL, strdata(name));
    if (ctype_isconstval(ct->info)) {
      CType *ctt = ctype_child(cts, ct);
      lj_assertCTS(ctype_isinteger(ctt->info) && ctt->size <= 4,
		   "only 32 bit const supported");  /* NYI */
      if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
	setnumV(tv, (lua_Number)(uint32_t)ct->size);
      else
	setintV(tv, (int32_t)ct->size);
    } else {
      const char *sym = clib_extsym(cts, ct, name);
#if LJ_TARGET_WINDOWS
      DWORD oldwerr = GetLastError();
#endif
      void *p = clib_getsym(cl, sym);
      GCcdata *cd;
      lj_assertCTS(ctype_isfunc(ct->info) || ctype_isextern(ct->info),
		   "unexpected ctype %08x in clib", ct->info);
#if LJ_TARGET_X86 && LJ_ABI_WIN
      /* Retry with decorated name for fastcall/stdcall functions. */
      if (!p && ctype_isfunc(ct->info)) {
	CTInfo cconv = ctype_cconv(ct->info);
	if (cconv == CTCC_FASTCALL || cconv == CTCC_STDCALL) {
	  CTSize sz = clib_func_argsize(cts, ct);
	  const char *symd = lj_strfmt_pushf(L,
			       cconv == CTCC_FASTCALL ? "@%s@%d" : "_%s@%d",
			       sym, sz);
	  L->top--;
	  p = clib_getsym(cl, symd);
	}
      }
#endif
      if (!p)
	clib_error(L, "cannot resolve symbol " LUA_QS ": %s", sym);
#if LJ_TARGET_WINDOWS
      SetLastError(oldwerr);
#endif
      cd = lj_cdata_new(cts, id, CTSIZE_PTR);
      *(void **)cdataptr(cd) = p;
      setcdataV(L, tv, cd);
      lj_gc_anybarriert(L, cl->cache);
    }
  }
  return tv;
}